

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprMightBeIndexed(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr,int op)

{
  int iTab;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  Index *pIVar5;
  
  if ((op - 0x36U < 4) && (pExpr->op == 0xa5)) {
    pExpr = ((pExpr->x).pList)->a[0].pExpr;
  }
  if (pExpr->op == 0x9e) {
    *aiCurCol = pExpr->iTable;
    aiCurCol[1] = (int)pExpr->iColumn;
    return 1;
  }
  if ((mPrereq ^ mPrereq - 1) <= mPrereq - 1) {
    return 0;
  }
  lVar3 = 0;
  if (1 < mPrereq) {
    do {
      lVar3 = lVar3 + 1;
      bVar1 = 3 < mPrereq;
      mPrereq = mPrereq >> 1;
    } while (bVar1);
  }
  pIVar5 = (pFrom->a[lVar3].pTab)->pIndex;
  if (pIVar5 != (Index *)0x0) {
    iTab = pFrom->a[lVar3].iCursor;
    do {
      if ((pIVar5->aColExpr != (ExprList *)0x0) && (pIVar5->nKeyCol != 0)) {
        lVar3 = 4;
        uVar4 = 0;
        do {
          if ((pIVar5->aiColumn[uVar4] == -2) &&
             (iVar2 = sqlite3ExprCompareSkip
                                (pExpr,*(Expr **)((long)pIVar5->aColExpr->a + lVar3 * 2 + -8),iTab),
             iVar2 == 0)) {
            *aiCurCol = iTab;
            aiCurCol[1] = -2;
            return 1;
          }
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar4 < pIVar5->nKeyCol);
      }
      pIVar5 = pIVar5->pNext;
    } while (pIVar5 != (Index *)0x0);
  }
  return 0;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  return exprMightBeIndexed2(pFrom,mPrereq,aiCurCol,pExpr);
}